

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall MXNetNode::attr_af(MXNetNode *this,char *key)

{
  bool bVar1;
  const_iterator __x;
  const_iterator key_00;
  long lVar2;
  char *in_RDX;
  vector<float,_std::allocator<float>_> *in_RDI;
  int nscan;
  int nconsumed;
  int c;
  float i;
  const_iterator it;
  vector<float,_std::allocator<float>_> *list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar3;
  vector<float,_std::allocator<float>_> *this_00;
  int local_7c;
  int local_78;
  int local_74;
  undefined4 local_70 [2];
  float local_68;
  undefined1 local_61;
  MXNetNode *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  MXNetNode *in_stack_ffffffffffffffb8;
  string local_40 [32];
  _Self local_20 [4];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDX,(allocator *)&stack0xffffffffffffffbf);
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find(in_stack_ffffffffffffff38,(key_type *)0x118f5c);
  local_20[0]._M_node = __x._M_node;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  key_00 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffa0);
  if (bVar1) {
    memset(this_00,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x118fd0);
  }
  else {
    local_61 = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x119021);
    bVar1 = is_attr_scalar(in_stack_ffffffffffffffa8,(char *)key_00._M_node);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44);
    if (bVar1) {
      local_68 = attr_f(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)CONCAT44(uVar3,local_68),
                 (value_type_conflict1 *)in_stack_ffffffffffffff38);
    }
    else {
      local_70[0] = 0;
      local_74 = 0;
      local_78 = 0;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1190cf);
      lVar2 = std::__cxx11::string::c_str();
      local_7c = __isoc99_sscanf(lVar2 + local_74,"%*[(,]%f%n",local_70,&local_78);
      while (local_7c == 1) {
        std::vector<float,_std::allocator<float>_>::push_back
                  (this_00,(value_type_conflict1 *)__x._M_node);
        local_70[0] = 0;
        local_74 = local_78 + local_74;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x11913c);
        lVar2 = std::__cxx11::string::c_str();
        local_7c = __isoc99_sscanf(lVar2 + local_74,"%*[(,]%f%n",local_70,&local_78);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<float> MXNetNode::attr_af(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<float>();

    // (0.1,0.2,0.3)
    std::vector<float> list;

    if (is_attr_scalar(key))
    {
        list.push_back(attr_f(key));
        return list;
    }

    float i = 0.f;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    while (nscan == 1)
    {
        list.push_back(i);
        //         fprintf(stderr, "%f\n", i);

        i = 0.f;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    }

    return list;
}